

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseUIComponent.cpp
# Opt level: O0

void __thiscall nite::PoliVec2::set(PoliVec2 *this,string *w,string *h)

{
  char *pcVar1;
  long lVar2;
  double dVar3;
  string local_b0;
  undefined1 local_90 [8];
  string hi;
  string local_60;
  undefined1 local_40 [8];
  string wi;
  string *h_local;
  string *w_local;
  PoliVec2 *this_local;
  
  this->useAbs = false;
  wi.field_2._8_8_ = h;
  std::__cxx11::string::string((string *)&local_60,(string *)w);
  strRemoveSpaces((string *)local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::string((string *)&local_b0,(string *)wi.field_2._8_8_);
  strRemoveSpaces((string *)local_90,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::length();
  pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)local_40);
  if (*pcVar1 == '%') {
    lVar2 = std::__cxx11::string::length();
    std::__cxx11::string::erase((ulong)local_40,lVar2 - 1);
  }
  std::__cxx11::string::length();
  pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)local_90);
  if (*pcVar1 == '%') {
    lVar2 = std::__cxx11::string::length();
    std::__cxx11::string::erase((ulong)local_90,lVar2 - 1);
  }
  dVar3 = toFloat((string *)local_40);
  (this->rel).x = (float)(dVar3 / 100.0);
  dVar3 = toFloat((string *)local_90);
  (this->rel).y = (float)(dVar3 / 100.0);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void nite::PoliVec2::set(const String &w, const String &h){
    this->useAbs = false;
    String wi = nite::strRemoveSpaces(w);
    String hi = nite::strRemoveSpaces(h);
    if(wi[wi.length()-1] == '%'){
        wi.erase(wi.length()-1);
    }
    if(hi[hi.length()-1] == '%'){
        hi.erase(hi.length()-1);
    }    
    this->rel.x = nite::toFloat(wi) / 100.0f;
    this->rel.y = nite::toFloat(hi) / 100.0f;
}